

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O2

void al_compose_transform(ALLEGRO_TRANSFORM *trans,ALLEGRO_TRANSFORM *other)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  fVar1 = trans->m[0][0];
  fVar2 = trans->m[0][1];
  fVar3 = trans->m[0][2];
  fVar4 = trans->m[0][3];
  fVar17 = other->m[0][0];
  fVar18 = other->m[0][1];
  fVar19 = other->m[0][2];
  fVar20 = other->m[0][3];
  fVar21 = other->m[1][0];
  fVar22 = other->m[1][1];
  fVar23 = other->m[1][2];
  fVar24 = other->m[1][3];
  fVar25 = other->m[2][0];
  fVar26 = other->m[2][1];
  fVar27 = other->m[2][2];
  fVar28 = other->m[2][3];
  fVar29 = other->m[3][0];
  fVar30 = other->m[3][1];
  fVar31 = other->m[3][2];
  fVar32 = other->m[3][3];
  fVar5 = trans->m[1][1];
  fVar6 = trans->m[1][0];
  fVar7 = trans->m[1][2];
  fVar8 = trans->m[1][3];
  fVar9 = trans->m[2][1];
  fVar10 = trans->m[2][0];
  fVar11 = trans->m[2][2];
  fVar12 = trans->m[2][3];
  fVar13 = trans->m[3][1];
  fVar14 = trans->m[3][0];
  fVar15 = trans->m[3][2];
  fVar16 = trans->m[3][3];
  trans->m[0][0] = fVar4 * fVar29 + fVar3 * fVar25 + fVar1 * fVar17 + fVar2 * fVar21;
  trans->m[0][1] = fVar4 * fVar30 + fVar3 * fVar26 + fVar1 * fVar18 + fVar2 * fVar22;
  trans->m[0][2] = fVar4 * fVar31 + fVar3 * fVar27 + fVar1 * fVar19 + fVar2 * fVar23;
  trans->m[0][3] = fVar4 * fVar32 + fVar3 * fVar28 + fVar1 * fVar20 + fVar2 * fVar24;
  trans->m[1][0] = fVar8 * fVar29 + fVar7 * fVar25 + fVar6 * fVar17 + fVar5 * fVar21;
  trans->m[1][1] = fVar8 * fVar30 + fVar7 * fVar26 + fVar6 * fVar18 + fVar5 * fVar22;
  trans->m[1][2] = fVar8 * fVar31 + fVar7 * fVar27 + fVar6 * fVar19 + fVar5 * fVar23;
  trans->m[1][3] = fVar8 * fVar32 + fVar7 * fVar28 + fVar6 * fVar20 + fVar5 * fVar24;
  trans->m[2][0] = fVar12 * fVar29 + fVar11 * fVar25 + fVar10 * fVar17 + fVar9 * fVar21;
  trans->m[2][1] = fVar12 * fVar30 + fVar11 * fVar26 + fVar10 * fVar18 + fVar9 * fVar22;
  trans->m[2][2] = fVar12 * fVar31 + fVar11 * fVar27 + fVar10 * fVar19 + fVar9 * fVar23;
  trans->m[2][3] = fVar12 * fVar32 + fVar11 * fVar28 + fVar10 * fVar20 + fVar9 * fVar24;
  trans->m[3][0] = fVar16 * fVar29 + fVar15 * fVar25 + fVar14 * fVar17 + fVar13 * fVar21;
  trans->m[3][1] = fVar16 * fVar30 + fVar15 * fVar26 + fVar14 * fVar18 + fVar13 * fVar22;
  trans->m[3][2] = fVar16 * fVar31 + fVar15 * fVar27 + fVar14 * fVar19 + fVar13 * fVar23;
  trans->m[3][3] = fVar16 * fVar32 + fVar15 * fVar28 + fVar14 * fVar20 + fVar13 * fVar24;
  return;
}

Assistant:

void al_compose_transform(ALLEGRO_TRANSFORM *trans, const ALLEGRO_TRANSFORM *other)
{
   #define E(x, y)                        \
      (other->m[0][y] * trans->m[x][0] +  \
       other->m[1][y] * trans->m[x][1] +  \
       other->m[2][y] * trans->m[x][2] +  \
       other->m[3][y] * trans->m[x][3])   \

   const ALLEGRO_TRANSFORM tmp = {{
      { E(0, 0), E(0, 1), E(0, 2), E(0, 3) },
      { E(1, 0), E(1, 1), E(1, 2), E(1, 3) },
      { E(2, 0), E(2, 1), E(2, 2), E(2, 3) },
      { E(3, 0), E(3, 1), E(3, 2), E(3, 3) }
   }};

   *trans = tmp;

   #undef E
}